

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O3

void __thiscall
pstore::command_line::
opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
opt<pstore::command_line::details::positional,pstore::command_line::details::required,pstore::command_line::usage>
          (opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *this,
          positional *mods,required *mods_1,usage *mods_2)

{
  option::option((option *)this);
  *(undefined ***)this = &PTR__opt_0012ae80;
  *(opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> **)
   (this + 0x88) = this + 0x98;
  *(undefined8 *)(this + 0x90) = 0;
  this[0x98] = (opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>)
               0x0;
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined ***)(this + 0xa8) = &PTR__parser_0012b820;
  option::set_positional((option *)this);
  option::set_num_occurrences_flag((option *)this,required);
  option::set_usage((option *)this,&mods_2->desc_);
  return;
}

Assistant:

explicit opt (Mods const &... mods)
                    : option () {
                apply_to_option (*this, mods...);
            }